

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
emplaceRealloc<slang::ast::OpaqueInstancePath::Entry>
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,pointer pos,Entry *args)

{
  pointer pEVar1;
  ulong uVar2;
  Entry *__cur_1;
  pointer pEVar3;
  pointer pEVar4;
  uintptr_t *puVar5;
  pointer pEVar6;
  EVP_PKEY_CTX *pEVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar2 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar2 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    pEVar7 = (EVP_PKEY_CTX *)0xfffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pEVar3 = (pointer)operator_new((long)pEVar7 * 8);
  *(uintptr_t *)((long)pEVar3 + lVar8) = args->value;
  pEVar6 = this->data_;
  pEVar1 = pEVar6 + this->len;
  pEVar4 = pEVar3;
  if (pEVar1 == pos) {
    for (; pEVar6 != pos; pEVar6 = pEVar6 + 1) {
      pEVar4->value = pEVar6->value;
      pEVar4 = pEVar4 + 1;
    }
  }
  else {
    for (; pEVar6 != pos; pEVar6 = pEVar6 + 1) {
      ctx = (EVP_PKEY_CTX *)pEVar6->value;
      pEVar4->value = (uintptr_t)ctx;
      pEVar4 = pEVar4 + 1;
    }
    puVar5 = (uintptr_t *)(lVar8 + (long)pEVar3);
    for (; puVar5 = puVar5 + 1, pos != pEVar1; pos = pos + 1) {
      *puVar5 = pos->value;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar7;
  this->data_ = pEVar3;
  return (pointer)((long)pEVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}